

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp.c
# Opt level: O0

void clear(Kmpp *ctx)

{
  MPP_RET MVar1;
  MPP_RET ret;
  Kmpp *ctx_local;
  
  if (ctx != (Kmpp *)0x0) {
    if ((ctx->mChanDup == 0) &&
       (MVar1 = mpp_vcodec_ioctl(ctx->mClientFd,1,0,0,(void *)0x0), MVar1 != MPP_OK)) {
      _mpp_log_l(2,"kmpp","chan %d VCODEC_CHAN_DESTROY failed\n",(char *)0x0,
                 (ulong)(uint)ctx->mChanId);
    }
    if (-1 < ctx->mClientFd) {
      mpp_vcodec_close(ctx->mClientFd);
    }
    ctx->mClientFd = -1;
    if (ctx->mPacketGroup != (MppBufferGroup)0x0) {
      mpp_buffer_group_put(ctx->mPacketGroup);
      ctx->mPacketGroup = (MppBufferGroup)0x0;
    }
    if (ctx->mVencPacketPool != (MppMemPool)0x0) {
      mpp_mem_pool_deinit_f("clear",ctx->mVencPacketPool);
      ctx->mVencPacketPool = (MppMemPool)0x0;
    }
  }
  return;
}

Assistant:

static void clear(Kmpp *ctx)
{
    if (!ctx)
        return;

    if (!ctx->mChanDup) {
        MPP_RET ret;

        ret = mpp_vcodec_ioctl(ctx->mClientFd, VCODEC_CHAN_DESTROY, 0, 0, 0);
        if (ret)
            mpp_err("chan %d VCODEC_CHAN_DESTROY failed\n", ctx->mChanId);
    }

    if (ctx->mClientFd >= 0)
        mpp_vcodec_close(ctx->mClientFd);
    ctx->mClientFd = -1;

    if (ctx->mPacketGroup) {
        mpp_buffer_group_put(ctx->mPacketGroup);
        ctx->mPacketGroup = NULL;
    }

    if (ctx->mVencPacketPool) {
        mpp_mem_pool_deinit(ctx->mVencPacketPool);
        ctx->mVencPacketPool = NULL;
    }
}